

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.h
# Opt level: O2

int nng_args_parse(int argc,char **argv,nng_arg_spec *specs,int *val,char **optarg,int *optidx)

{
  char cVar1;
  int iVar2;
  char *__s2;
  int iVar3;
  size_t sVar4;
  int iVar5;
  char *pcVar6;
  size_t __n;
  nng_arg_spec *local_60;
  int local_38;
  
  iVar2 = *optidx;
  iVar5 = -1;
  if (iVar2 < argc) {
    pcVar6 = argv[iVar2];
    if (*pcVar6 == '-') {
      cVar1 = pcVar6[1];
      if (cVar1 == '\0') {
        *optidx = iVar2 + 1;
      }
      else {
        if (cVar1 == '-') {
          pcVar6 = pcVar6 + 2;
          __n = 0;
          while ((0x3d < (ulong)(byte)pcVar6[__n] ||
                 ((0x2400000000000001U >> ((ulong)(byte)pcVar6[__n] & 0x3f) & 1) == 0))) {
            __n = __n + 1;
          }
        }
        else {
          pcVar6 = pcVar6 + 1;
          __n = 1;
        }
        local_60 = (nng_arg_spec *)0x0;
        local_38 = 0;
        iVar5 = -2;
        for (; specs->a_val != 0; specs = specs + 1) {
          if (cVar1 == '-') {
            __s2 = specs->a_name;
            if ((__s2 != (char *)0x0) && (iVar3 = strncmp(pcVar6,__s2,__n), iVar3 == 0)) {
              sVar4 = strlen(__s2);
              if (sVar4 == __n) goto LAB_00102643;
              local_38 = local_38 + 1;
              local_60 = specs;
            }
          }
          else if (specs->a_short == (int)*pcVar6) goto LAB_00102643;
        }
        if (local_38 != 0) {
          specs = local_60;
          if (local_38 == 1) {
LAB_00102643:
            if (specs->a_arg == false) {
              if (pcVar6[__n] != '\0') {
                return -2;
              }
              *val = specs->a_val;
              *optidx = iVar2 + 1;
            }
            else {
              if (pcVar6[__n] == '\0') {
                iVar5 = iVar2 + 1;
                if (argc <= iVar5) {
                  return -4;
                }
                pcVar6 = argv[(long)iVar2 + 1];
              }
              else {
                pcVar6 = pcVar6 + (cVar1 == '-') + __n;
                iVar5 = iVar2;
              }
              *optarg = pcVar6;
              *optidx = iVar5 + 1;
              *val = specs->a_val;
            }
            iVar5 = 0;
          }
          else {
            iVar5 = -3;
          }
        }
      }
    }
  }
  return iVar5;
}

Assistant:

int
nng_args_parse(int argc, char *const *argv, const nng_arg_spec *specs,
    int *val, char **optarg, int *optidx)
{
	const nng_arg_spec *spec;
	int                 matches;
	bool                shortopt;
	size_t              l;
	char               *arg;
	int                 i;

	if ((i = *optidx) >= argc) {
		return (-1);
	}
	arg = argv[*optidx];

	if (arg[0] != '-') {
		return (-1);
	}
	if (arg[1] == '\0') {
		*optidx = i + 1;
		return (-1);
	}

	if ((arg[0] == '-') && (arg[1] == '-')) {
		arg += 2;
		shortopt = false;
		for (l = 0; arg[l] != '\0'; l++) {
			if ((arg[l] == '=') || (arg[l] == ':')) {
				break;
			}
		}
	} else {
		arg++;
		shortopt = true;
		l        = 1;
	}

	matches = 0;
	spec    = NULL;

	for (int x = 0; specs[x].a_val != 0; x++) {

		if (shortopt) {
			if (arg[0] == specs[x].a_short) {
				matches = 1;
				spec    = &specs[x];
				break;
			}
			continue;
		}

		if ((specs[x].a_name == NULL) ||
		    (strncmp(arg, specs[x].a_name, l) != 0)) {
			continue;
		}
		matches++;
		spec = &specs[x];

		if (strlen(specs[x].a_name) == l) {
			// Perfect match.
			matches = 1;
			break;
		}
	}

	switch (matches) {
	case 1:
		// Exact match
		break;
	case 0:
		// No such option
		return (NNG_ARG_INVAL);
		break;
	default:
		// Ambiguous (not match)
		return (NNG_ARG_AMBIG);
		break;
	}

	if (!spec->a_arg) {
		// No option clustering for short options yet.
		if (arg[l] != '\0') {
			return (NNG_ARG_INVAL);
		}
		*val    = spec->a_val;
		*optidx = i + 1;
		return (0);
	}

	if (arg[l] != '\0') {
		if (shortopt) {
			*optarg = arg + l;
		} else {
			*optarg = arg + l + 1;
		}
	} else {
		i++;
		if (i >= argc) {
			return (NNG_ARG_MISSING);
		}
		*optarg = argv[i];
	}
	*optidx = ++i;
	*val    = spec->a_val;

	return (0);
}